

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

LinkClosure * __thiscall cmTarget::GetLinkClosure(cmTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>_>,_bool>
  pVar3;
  string key;
  LinkClosure lc;
  value_type entry;
  string local_d0;
  LinkClosure local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>
  local_78;
  
  cmsys::SystemTools::UpperCase(&local_d0,config);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>_>_>
          ::find(&(((this->Internal).Pointer)->LinkClosureMap)._M_t,&local_d0);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(((this->Internal).Pointer)->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header) {
    paVar1 = &local_b0.LinkerLanguage.field_2;
    local_b0.LinkerLanguage._M_string_length = 0;
    local_b0.LinkerLanguage.field_2._M_local_buf[0] = '\0';
    local_b0.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0.LinkerLanguage._M_dataplus._M_p = (pointer)paVar1;
    ComputeLinkClosure(this,config,&local_b0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget::LinkClosure_&,_true>
              (&local_78,&local_d0,&local_b0);
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::LinkClosure>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::LinkClosure>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::LinkClosure>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmTarget::LinkClosure>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::LinkClosure>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::LinkClosure>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::LinkClosure>>>
                        *)&((this->Internal).Pointer)->LinkClosureMap,&local_78);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78.second.Languages);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.second.LinkerLanguage._M_dataplus._M_p !=
        &local_78.second.LinkerLanguage.field_2) {
      operator_delete(local_78.second.LinkerLanguage._M_dataplus._M_p,
                      local_78.second.LinkerLanguage.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      local_78.first.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0.Languages);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.LinkerLanguage._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.LinkerLanguage._M_dataplus._M_p,
                      CONCAT71(local_b0.LinkerLanguage.field_2._M_allocated_capacity._1_7_,
                               local_b0.LinkerLanguage.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return (LinkClosure *)(iVar2._M_node + 2);
}

Assistant:

cmTarget::LinkClosure const*
cmTarget::GetLinkClosure(const std::string& config) const
{
  std::string key(cmSystemTools::UpperCase(config));
  cmTargetInternals::LinkClosureMapType::iterator
    i = this->Internal->LinkClosureMap.find(key);
  if(i == this->Internal->LinkClosureMap.end())
    {
    LinkClosure lc;
    this->ComputeLinkClosure(config, lc);
    cmTargetInternals::LinkClosureMapType::value_type entry(key, lc);
    i = this->Internal->LinkClosureMap.insert(entry).first;
    }
  return &i->second;
}